

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O1

point<float,_784UL> * __thiscall
pico_tree::internal::random_normal<float,784ul>
          (point<float,_784UL> *__return_storage_ptr__,internal *this,size_t dim)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  ulong uVar7;
  size_t __i;
  long lVar8;
  internal *piVar9;
  result_type rVar10;
  float fVar11;
  mt19937 e;
  random_device rd;
  param_type local_2748;
  undefined4 local_2740;
  undefined1 local_273c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2738;
  random_device local_13b0;
  
  std::random_device::random_device(&local_13b0);
  uVar6 = ::std::random_device::_M_getval();
  local_2738._M_x[0] = (unsigned_long)uVar6;
  lVar8 = 1;
  uVar7 = local_2738._M_x[0];
  do {
    uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar8);
    local_2738._M_x[lVar8] = uVar7;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2738._M_p = 0x270;
  local_2748._M_mean = 0.0;
  local_2748._M_stddev = 1.0;
  local_2740 = 0;
  local_273c = 0;
  memset(__return_storage_ptr__,0,0xc40);
  if (this != (internal *)0x0) {
    piVar9 = (internal *)0x0;
    do {
      rVar10 = ::std::normal_distribution<float>::operator()(&local_2748,&local_2738,&local_2748);
      (__return_storage_ptr__->elems_)._M_elems[(long)piVar9] = rVar10;
      piVar9 = piVar9 + 1;
    } while (this != piVar9);
  }
  fVar11 = 0.0;
  lVar8 = 0;
  do {
    fVar3 = *(float *)((long)(__return_storage_ptr__->elems_)._M_elems + lVar8);
    fVar11 = fVar11 + fVar3 * fVar3;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc40);
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  fVar11 = 1.0 / fVar11;
  lVar8 = 0;
  do {
    pfVar1 = (__return_storage_ptr__->elems_)._M_elems + lVar8;
    fVar3 = pfVar1[1];
    fVar4 = pfVar1[2];
    fVar5 = pfVar1[3];
    pfVar2 = (__return_storage_ptr__->elems_)._M_elems + lVar8;
    *pfVar2 = *pfVar1 * fVar11;
    pfVar2[1] = fVar3 * fVar11;
    pfVar2[2] = fVar4 * fVar11;
    pfVar2[3] = fVar5 * fVar11;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x310);
  ::std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

inline point<Scalar_, Dim_> random_normal(size_t dim) {
  std::random_device rd;
  std::mt19937 e(rd());
  std::normal_distribution<Scalar_> gaussian(Scalar_(0), Scalar_(1));

  point<Scalar_, Dim_> v = point<Scalar_, Dim_>::from_size(dim);

  for (size_t i = 0; i < dim; ++i) {
    v[i] = gaussian(e);
  }

  v.normalize();

  return v;
}